

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  Type TVar4;
  uint32 x;
  int64 iVar5;
  char *pcVar6;
  long lVar7;
  LogMessage *this;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  string bytes;
  uint32 length;
  string *default_string;
  bool has_default_value;
  unsigned_long in_stack_fffffffffffffc78;
  int i32;
  LogMessage *other;
  LogMessage *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  allocator *paVar8;
  LogMessage *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  undefined1 add_float_suffix;
  AlphaNum *in_stack_fffffffffffffcb8;
  string *val;
  undefined8 in_stack_fffffffffffffcc8;
  float value;
  double in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffcf8;
  LogMessage local_2d0;
  allocator local_291;
  string local_290 [8];
  EnumValueDescriptor *in_stack_fffffffffffffd78;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  uint32 local_1a8;
  allocator local_1a1;
  string *local_1a0;
  byte local_192;
  allocator local_191;
  string local_190;
  string local_170 [80];
  string local_120 [80];
  string local_d0 [39];
  allocator local_a9 [49];
  string local_78 [83];
  allocator local_25 [20];
  allocator local_11;
  FieldDescriptor *local_10;
  
  add_float_suffix = (undefined1)((ulong)in_stack_fffffffffffffcb0 >> 0x38);
  value = (float)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  local_10 = in_RSI;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x499c37);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"nil",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x499cb5);
    switch(CVar2) {
    case CPPTYPE_INT32:
      iVar3 = FieldDescriptor::default_value_int32(local_10);
      i32 = (int)(in_stack_fffffffffffffc78 >> 0x20);
      if (iVar3 == -0x80000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"-0x80000000",local_25);
        std::allocator<char>::~allocator((allocator<char> *)local_25);
      }
      else {
        FieldDescriptor::default_value_int32(local_10);
        strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffc80,i32);
        StrCat_abi_cxx11_(in_stack_fffffffffffffcb8);
      }
      break;
    case CPPTYPE_INT64:
      iVar5 = FieldDescriptor::default_value_int64(local_10);
      if (iVar5 == -0x8000000000000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"-0x8000000000000000LL",local_a9);
        std::allocator<char>::~allocator((allocator<char> *)local_a9);
      }
      else {
        FieldDescriptor::default_value_int64(local_10);
        strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78)
        ;
        StrCat_abi_cxx11_(in_stack_fffffffffffffcb8);
        std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
        std::__cxx11::string::~string(local_d0);
      }
      break;
    case CPPTYPE_UINT32:
      FieldDescriptor::default_value_uint32(local_10);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffffc80,(uint)(in_stack_fffffffffffffc78 >> 0x20));
      StrCat_abi_cxx11_(in_stack_fffffffffffffcb8);
      std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_78);
      break;
    case CPPTYPE_UINT64:
      FieldDescriptor::default_value_uint64(local_10);
      strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      StrCat_abi_cxx11_(in_stack_fffffffffffffcb8);
      std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_120);
      break;
    case CPPTYPE_DOUBLE:
      FieldDescriptor::default_value_double(local_10);
      SimpleDtoa_abi_cxx11_(in_stack_fffffffffffffcd8);
      HandleExtremeFloatingPoint((string *)in_stack_fffffffffffffcb8,(bool)add_float_suffix);
      std::__cxx11::string::~string(local_170);
      break;
    case CPPTYPE_FLOAT:
      FieldDescriptor::default_value_float(local_10);
      val = &local_190;
      SimpleFtoa_abi_cxx11_(value);
      HandleExtremeFloatingPoint(val,(bool)add_float_suffix);
      std::__cxx11::string::~string((string *)&local_190);
      break;
    case CPPTYPE_BOOL:
      bVar1 = FieldDescriptor::default_value_bool(local_10);
      pcVar6 = "NO";
      if (bVar1) {
        pcVar6 = "YES";
      }
      paVar8 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar6,paVar8);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      break;
    case CPPTYPE_ENUM:
      FieldDescriptor::default_value_enum((FieldDescriptor *)in_stack_fffffffffffffc80);
      EnumValueName_abi_cxx11_(in_stack_fffffffffffffd78);
      break;
    case CPPTYPE_STRING:
      local_192 = FieldDescriptor::has_default_value(local_10);
      local_1a0 = FieldDescriptor::default_value_string_abi_cxx11_(local_10);
      if (((local_192 & 1) == 0) || (lVar7 = std::__cxx11::string::length(), lVar7 == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"nil",&local_1a1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      }
      else {
        TVar4 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffc90);
        if (TVar4 == TYPE_BYTES) {
          x = std::__cxx11::string::length();
          local_1a8 = ghtonl(x);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c8,(char *)&local_1a8,4,&local_1c9);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          std::__cxx11::string::append(local_1c8);
          CEscape(in_stack_fffffffffffffca8);
          EscapeTrigraphs(in_stack_fffffffffffffcf8);
          std::operator+((char *)in_stack_fffffffffffffc88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc80);
          std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
          std::__cxx11::string::~string(local_1f0);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::string::~string(local_230);
          std::__cxx11::string::~string(local_1c8);
        }
        else {
          CEscape(in_stack_fffffffffffffca8);
          EscapeTrigraphs(in_stack_fffffffffffffcf8);
          std::operator+((char *)in_stack_fffffffffffffc88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc80);
          std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
          std::__cxx11::string::~string(local_250);
          std::__cxx11::string::~string(local_270);
          std::__cxx11::string::~string(local_290);
        }
      }
      break;
    case CPPTYPE_MESSAGE:
      paVar8 = &local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"nil",paVar8);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      break;
    default:
      other = &local_2d0;
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffc90,(LogLevel)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                 (char *)in_stack_fffffffffffffc80,(int)((ulong)other >> 0x20));
      this = internal::LogMessage::operator<<(in_stack_fffffffffffffc80,(char *)other);
      internal::LogFinisher::operator=((LogFinisher *)this,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x49a599);
      std::__cxx11::string::string((string *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "U";
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return StrCat(field->default_value_int64()) + "LL";
    case FieldDescriptor::CPPTYPE_UINT64:
      return StrCat(field->default_value_uint64()) + "ULL";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      const string& default_string = field->default_value_string();
      if (!has_default_value || default_string.length() == 0) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32 length = ghtonl(default_string.length());
        string bytes((const char*)&length, sizeof(length));
        bytes.append(default_string);
        return "(NSData*)\"" + EscapeTrigraphs(CEscape(bytes)) + "\"";
      } else {
        return "@\"" + EscapeTrigraphs(CEscape(default_string)) + "\"";
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return string();
}